

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeIncrMergerNew(SortSubtask *pTask,MergeEngine *pMerger,IncrMerger **ppOut)

{
  int iVar1;
  int local_40;
  IncrMerger *local_38;
  IncrMerger *pIncr;
  int rc;
  IncrMerger **ppOut_local;
  MergeEngine *pMerger_local;
  SortSubtask *pTask_local;
  
  pIncr._4_4_ = 0;
  iVar1 = sqlite3FaultSim(100);
  if (iVar1 == 0) {
    local_38 = (IncrMerger *)sqlite3MallocZero(0x48);
  }
  else {
    local_38 = (IncrMerger *)0x0;
  }
  *ppOut = local_38;
  if (local_38 == (IncrMerger *)0x0) {
    vdbeMergeEngineFree(pMerger);
    pIncr._4_4_ = 7;
  }
  else {
    local_38->pMerger = pMerger;
    local_38->pTask = pTask;
    if (pTask->pSorter->mxPmaSize / 2 < pTask->pSorter->mxKeysize + 9) {
      local_40 = pTask->pSorter->mxKeysize + 9;
    }
    else {
      local_40 = pTask->pSorter->mxPmaSize / 2;
    }
    local_38->mxSz = local_40;
    (pTask->file2).iEof = (long)local_38->mxSz + (pTask->file2).iEof;
  }
  return pIncr._4_4_;
}

Assistant:

static int vdbeIncrMergerNew(
  SortSubtask *pTask,     /* The thread that will be using the new IncrMerger */
  MergeEngine *pMerger,   /* The MergeEngine that the IncrMerger will control */
  IncrMerger **ppOut      /* Write the new IncrMerger here */
){
  int rc = SQLITE_OK;
  IncrMerger *pIncr = *ppOut = (IncrMerger*)
       (sqlite3FaultSim(100) ? 0 : sqlite3MallocZero(sizeof(*pIncr)));
  if( pIncr ){
    pIncr->pMerger = pMerger;
    pIncr->pTask = pTask;
    pIncr->mxSz = MAX(pTask->pSorter->mxKeysize+9,pTask->pSorter->mxPmaSize/2);
    pTask->file2.iEof += pIncr->mxSz;
  }else{
    vdbeMergeEngineFree(pMerger);
    rc = SQLITE_NOMEM_BKPT;
  }
  return rc;
}